

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

char * __thiscall mpt::message_store::entry::source(entry *this)

{
  size_t sVar1;
  char *pcVar2;
  header *h;
  entry *this_local;
  
  sVar1 = array::length(&this->super_array);
  if (sVar1 < 5) {
    this_local = (entry *)0x0;
  }
  else {
    pcVar2 = (char *)array::base(&this->super_array);
    if (*pcVar2 == '\0') {
      this_local = (entry *)0x0;
    }
    else {
      this_local = (entry *)(pcVar2 + 4);
    }
  }
  return (char *)this_local;
}

Assistant:

const char *message_store::entry::source() const
{
	header *h;
	
	if (length() < (sizeof(*h) + 1)) {
		return 0;
	}
	h = static_cast<header *>(base());
	
	if (!h->from) {
		return 0;
	}
	return (const char *) (h + 1);
}